

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::AddCacheEntry(cmake *this,string *key,char *value,char *helpString,int type)

{
  cmMessenger *pcVar1;
  bool bVar2;
  bool local_59;
  bool local_39;
  int type_local;
  char *helpString_local;
  char *value_local;
  string *key_local;
  cmake *this_local;
  
  cmState::AddCacheEntry(this->State,key,value,helpString,type);
  UnwatchUnusedCli(this,key);
  bVar2 = std::operator==(key,"CMAKE_WARN_DEPRECATED");
  if (bVar2) {
    pcVar1 = this->Messenger;
    local_39 = false;
    if (value != (char *)0x0) {
      local_39 = cmSystemTools::IsOff(value);
    }
    cmMessenger::SetSuppressDeprecatedWarnings(pcVar1,local_39);
  }
  else {
    bVar2 = std::operator==(key,"CMAKE_ERROR_DEPRECATED");
    if (bVar2) {
      pcVar1 = this->Messenger;
      bVar2 = cmSystemTools::IsOn(value);
      cmMessenger::SetDeprecatedWarningsAsErrors(pcVar1,bVar2);
    }
    else {
      bVar2 = std::operator==(key,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
      if (bVar2) {
        pcVar1 = this->Messenger;
        bVar2 = cmSystemTools::IsOn(value);
        cmMessenger::SetSuppressDevWarnings(pcVar1,bVar2);
      }
      else {
        bVar2 = std::operator==(key,"CMAKE_SUPPRESS_DEVELOPER_ERRORS");
        if (bVar2) {
          pcVar1 = this->Messenger;
          local_59 = false;
          if (value != (char *)0x0) {
            local_59 = cmSystemTools::IsOff(value);
          }
          cmMessenger::SetDevWarningsAsErrors(pcVar1,local_59);
        }
      }
    }
  }
  return;
}

Assistant:

void cmake::AddCacheEntry(const std::string& key, const char* value,
                          const char* helpString, int type)
{
  this->State->AddCacheEntry(key, value, helpString,
                             cmStateEnums::CacheEntryType(type));
  this->UnwatchUnusedCli(key);

  if (key == "CMAKE_WARN_DEPRECATED") {
    this->Messenger->SetSuppressDeprecatedWarnings(
      value && cmSystemTools::IsOff(value));
  } else if (key == "CMAKE_ERROR_DEPRECATED") {
    this->Messenger->SetDeprecatedWarningsAsErrors(cmSystemTools::IsOn(value));
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_WARNINGS") {
    this->Messenger->SetSuppressDevWarnings(cmSystemTools::IsOn(value));
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_ERRORS") {
    this->Messenger->SetDevWarningsAsErrors(value &&
                                            cmSystemTools::IsOff(value));
  }
}